

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_DDictHashSet_addDDict
                 (ZSTD_DDictHashSet *hashSet,ZSTD_DDict *ddict,ZSTD_customMem customMem)

{
  uint uVar1;
  size_t code;
  long in_RDI;
  ZSTD_DDictHashSet *in_stack_00000018;
  size_t err_code_1;
  ZSTD_customMem in_stack_00000030;
  size_t err_code;
  ZSTD_DDict *in_stack_ffffffffffffffb0;
  ZSTD_DDictHashSet *hashSet_00;
  size_t local_8;
  
  hashSet_00 = (ZSTD_DDictHashSet *)&stack0x00000008;
  if (((ulong)(*(long *)(in_RDI + 0x10) << 2) / *(ulong *)(in_RDI + 8)) * 3 != 0) {
    code = ZSTD_DDictHashSet_expand(in_stack_00000018,in_stack_00000030);
    uVar1 = ERR_isError(code);
    if (uVar1 != 0) {
      return code;
    }
  }
  local_8 = ZSTD_DDictHashSet_emplaceDDict(hashSet_00,in_stack_ffffffffffffffb0);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_DDictHashSet_addDDict(ZSTD_DDictHashSet* hashSet, const ZSTD_DDict* ddict, ZSTD_customMem customMem) {
    DEBUGLOG(4, "Adding dict ID: %u to hashset with - Count: %zu Tablesize: %zu", ZSTD_getDictID_fromDDict(ddict), hashSet->ddictPtrCount, hashSet->ddictPtrTableSize);
    if (hashSet->ddictPtrCount * DDICT_HASHSET_MAX_LOAD_FACTOR_COUNT_MULT / hashSet->ddictPtrTableSize * DDICT_HASHSET_MAX_LOAD_FACTOR_SIZE_MULT != 0) {
        FORWARD_IF_ERROR(ZSTD_DDictHashSet_expand(hashSet, customMem), "");
    }
    FORWARD_IF_ERROR(ZSTD_DDictHashSet_emplaceDDict(hashSet, ddict), "");
    return 0;
}